

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O3

this_t * __thiscall aeron::Context::conclude(Context *this)

{
  if (this->m_mediaDriverTimeout == -1) {
    this->m_mediaDriverTimeout = 10000;
  }
  if (this->m_resourceLingerTimeout == -1) {
    this->m_resourceLingerTimeout = 5000;
  }
  if (this->m_isOnNewExclusivePublicationHandlerSet == false) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
    ::operator=(&this->m_onNewExclusivePublicationHandler,&this->m_onNewPublicationHandler);
  }
  return this;
}

Assistant:

this_t& conclude()
    {
        if (NULL_TIMEOUT == m_mediaDriverTimeout)
        {
            m_mediaDriverTimeout = DEFAULT_MEDIA_DRIVER_TIMEOUT_MS;
        }

        if (NULL_TIMEOUT == m_resourceLingerTimeout)
        {
            m_resourceLingerTimeout = DEFAULT_RESOURCE_LINGER_MS;
        }

        if (!m_isOnNewExclusivePublicationHandlerSet)
        {
            m_onNewExclusivePublicationHandler = m_onNewPublicationHandler;
        }

        return *this;
    }